

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O0

void get_progress(void *coder_ptr,uint64_t *progress_in,uint64_t *progress_out)

{
  bool bVar1;
  uint mythread_j_927;
  uint mythread_i_927;
  size_t i;
  uint mythread_j_922;
  uint mythread_i_922;
  lzma_stream_coder_conflict1 *coder;
  uint64_t *progress_out_local;
  uint64_t *progress_in_local;
  void *coder_ptr_local;
  
  bVar1 = false;
  while (!bVar1) {
    mythread_mutex_lock((mythread_mutex *)((long)coder_ptr + 0x168));
    bVar1 = false;
    while (!bVar1) {
      *progress_in = *(uint64_t *)((long)coder_ptr + 0x158);
      *progress_out = *(uint64_t *)((long)coder_ptr + 0x160);
      for (_mythread_j_927 = 0; _mythread_j_927 < *(uint *)((long)coder_ptr + 0x144);
          _mythread_j_927 = _mythread_j_927 + 1) {
        bVar1 = false;
        while (!bVar1) {
          mythread_mutex_lock((mythread_mutex *)
                              (*(long *)((long)coder_ptr + 0x138) + _mythread_j_927 * 0x1c0 + 0x160)
                             );
          bVar1 = false;
          while (!bVar1) {
            *progress_in = *(long *)(*(long *)((long)coder_ptr + 0x138) + _mythread_j_927 * 0x1c0 +
                                    0x30) + *progress_in;
            *progress_out =
                 *(long *)(*(long *)((long)coder_ptr + 0x138) + _mythread_j_927 * 0x1c0 + 0x38) +
                 *progress_out;
            bVar1 = true;
          }
          bVar1 = true;
        }
        mythread_mutex_unlock
                  ((mythread_mutex *)
                   (*(long *)((long)coder_ptr + 0x138) + _mythread_j_927 * 0x1c0 + 0x160));
      }
      bVar1 = true;
    }
    bVar1 = true;
  }
  mythread_mutex_unlock((mythread_mutex *)((long)coder_ptr + 0x168));
  return;
}

Assistant:

static void
get_progress(void *coder_ptr, uint64_t *progress_in, uint64_t *progress_out)
{
	lzma_stream_coder *coder = coder_ptr;

	// Lock coder->mutex to prevent finishing threads from moving their
	// progress info from the worker_thread structure to lzma_stream_coder.
	mythread_sync(coder->mutex) {
		*progress_in = coder->progress_in;
		*progress_out = coder->progress_out;

		for (size_t i = 0; i < coder->threads_initialized; ++i) {
			mythread_sync(coder->threads[i].mutex) {
				*progress_in += coder->threads[i].progress_in;
				*progress_out += coder->threads[i]
						.progress_out;
			}
		}
	}